

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O0

void __thiscall CapabilitiesToStateMask::setSourcePixmapMask(CapabilitiesToStateMask *this)

{
  long in_RDI;
  
  updateStateBits((uint *)(in_RDI + 0xc),1,false);
  updateStateBits((uint *)(in_RDI + 0xc),2,false);
  updateStateBits((uint *)(in_RDI + 0xc),0x10,true);
  updateStateBits((uint *)(in_RDI + 0xc),0x20,false);
  updateStateBits((uint *)(in_RDI + 0xc),0x100,true);
  updateStateBits((uint *)(in_RDI + 0xc),0x1000,true);
  updateStateBits((uint *)(in_RDI + 0xc),0x2000,false);
  updateStateBits((uint *)(in_RDI + 0xc),0x4000,false);
  updateStateBits((uint *)(in_RDI + 0xc),0x10000,false);
  updateStateBits((uint *)(in_RDI + 0xc),0x20000,false);
  return;
}

Assistant:

void setSourcePixmapMask() {
        updateStateBits(&drawPixmapMask, STATE_XFORM_SCALE, false);
        updateStateBits(&drawPixmapMask, STATE_XFORM_COMPLEX, false);

        updateStateBits(&drawPixmapMask, STATE_BRUSH_PATTERN, true);
        updateStateBits(&drawPixmapMask, STATE_BRUSH_ALPHA, false);

        updateStateBits(&drawPixmapMask, STATE_PEN_ENABLED, true);

        updateStateBits(&drawPixmapMask, STATE_ANTIALIASING, true);
        updateStateBits(&drawPixmapMask, STATE_ALPHA, false);
        updateStateBits(&drawPixmapMask, STATE_BLENDING_COMPLEX, false);

        updateStateBits(&drawPixmapMask, STATE_CLIPSYS_COMPLEX, false);
        updateStateBits(&drawPixmapMask, STATE_CLIP_COMPLEX, false);
    }